

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O2

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  char *pcVar1;
  long lVar2;
  WritableFile *file;
  long *local_48;
  Status local_40;
  Status local_38;
  
  (*env->_vptr_Env[4])(this,env,fname,&local_48);
  if (*(long *)this == 0) {
    (**(code **)(*local_48 + 0x10))(&local_40,local_48,data);
    pcVar1 = *(char **)this;
    *(char **)this = local_40.state_;
    local_40.state_ = pcVar1;
    Status::~Status(&local_40);
    lVar2 = *(long *)this;
    if (should_sync && lVar2 == 0) {
      (**(code **)(*local_48 + 0x28))(&local_40);
      pcVar1 = *(char **)this;
      *(char **)this = local_40.state_;
      local_40.state_ = pcVar1;
      Status::~Status(&local_40);
      lVar2 = *(long *)this;
    }
    if (lVar2 == 0) {
      (**(code **)(*local_48 + 0x18))(&local_40);
      pcVar1 = *(char **)this;
      *(char **)this = local_40.state_;
      local_40.state_ = pcVar1;
      Status::~Status(&local_40);
    }
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    if (*(long *)this != 0) {
      (*env->_vptr_Env[8])(&local_38,env,fname);
      Status::~Status(&local_38);
    }
  }
  return (Status)(char *)this;
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->DeleteFile(fname);
  }
  return s;
}